

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cpp
# Opt level: O0

void asmjit::v1_14::DebugUtils::assertionFailed(char *file,int line,char *msg)

{
  undefined8 in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  char str [1024];
  char acStack_418 [1048];
  
  snprintf(acStack_418,0x400,"[asmjit] Assertion failed at %s (line %d):\n[asmjit] %s\n",in_RDI,
           (ulong)in_ESI,in_RDX);
  debugOutput((char *)0x1429c4);
  abort();
}

Assistant:

ASMJIT_FAVOR_SIZE void DebugUtils::assertionFailed(const char* file, int line, const char* msg) noexcept {
  char str[1024];

  snprintf(str, 1024,
    "[asmjit] Assertion failed at %s (line %d):\n"
    "[asmjit] %s\n", file, line, msg);

  debugOutput(str);
  ::abort();
}